

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxsteeppr.hpp
# Opt level: O0

void __thiscall soplex::SPxSteepPR<double>::setType(SPxSteepPR<double> *this,Type type)

{
  DIdxSet *this_00;
  Array<soplex::SPxPricer<double>::IdxElement> *this_01;
  int in_ESI;
  long in_RDI;
  Type in_stack_000000bc;
  SPxSteepPR<double> *in_stack_000000c0;
  undefined4 in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffac;
  SSVectorBase<double> *in_stack_ffffffffffffffb0;
  undefined8 in_stack_ffffffffffffffb8;
  int newmax;
  
  newmax = (int)((ulong)in_stack_ffffffffffffffb8 >> 0x20);
  this_00 = (DIdxSet *)(in_RDI + 0x88);
  std::shared_ptr<soplex::Tolerances>::shared_ptr
            ((shared_ptr<soplex::Tolerances> *)in_stack_ffffffffffffffb0,
             (shared_ptr<soplex::Tolerances> *)
             CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
  SSVectorBase<double>::setTolerances
            (in_stack_ffffffffffffffb0,
             (shared_ptr<soplex::Tolerances> *)
             CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
  std::shared_ptr<soplex::Tolerances>::~shared_ptr((shared_ptr<soplex::Tolerances> *)0x2e48ec);
  setupWeights(in_stack_000000c0,in_stack_000000bc);
  SSVectorBase<double>::clear(in_stack_ffffffffffffffb0);
  SSVectorBase<double>::clear(in_stack_ffffffffffffffb0);
  *(undefined1 *)(in_RDI + 0x154) = 0;
  IdxSet::clear((IdxSet *)(in_RDI + 0x108));
  SPxSolverBase<double>::dim((SPxSolverBase<double> *)0x2e494e);
  DIdxSet::setMax(this_00,newmax);
  SPxSolverBase<double>::dim((SPxSolverBase<double> *)0x2e4977);
  Array<soplex::SPxPricer<double>::IdxElement>::reSize
            ((Array<soplex::SPxPricer<double>::IdxElement> *)in_stack_ffffffffffffffb0,
             in_stack_ffffffffffffffac);
  if (in_ESI == -1) {
    IdxSet::clear((IdxSet *)(in_RDI + 0x128));
    this_01 = (Array<soplex::SPxPricer<double>::IdxElement> *)(in_RDI + 0x128);
    SPxSolverBase<double>::coDim((SPxSolverBase<double> *)0x2e49b8);
    DIdxSet::setMax(this_00,newmax);
    SPxSolverBase<double>::coDim((SPxSolverBase<double> *)0x2e49e1);
    Array<soplex::SPxPricer<double>::IdxElement>::reSize(this_01,in_stack_ffffffffffffffac);
  }
  return;
}

Assistant:

void SPxSteepPR<R>::setType(typename SPxSolverBase<R>::Type type)
{
   workRhs.setTolerances(this->_tolerances);

   setupWeights(type);
   workVec.clear();
   workRhs.clear();
   refined = false;

   bestPrices.clear();
   bestPrices.setMax(this->thesolver->dim());
   prices.reSize(this->thesolver->dim());

   if(type == SPxSolverBase<R>::ENTER)
   {
      bestPricesCo.clear();
      bestPricesCo.setMax(this->thesolver->coDim());
      pricesCo.reSize(this->thesolver->coDim());
   }
}